

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane_mixer.c
# Opt level: O1

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  mixed_channel_t speaker_count;
  float location [3];
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_f1;
  float local_f0;
  float fStack_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  byte local_d8 [48];
  float local_a8 [34];
  
  local_dc = source->min_distance;
  local_e4 = source->max_distance;
  local_e0 = source->rolloff;
  local_f0 = source->location[0] - data->location[0];
  fStack_ec = source->location[1] - data->location[1];
  local_e8 = source->location[2] - data->location[2];
  fVar4 = local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    fVar4 = auVar1._0_4_;
  }
  fVar6 = local_e4;
  if (fVar4 < local_e4) {
    fVar4 = local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
      fVar6 = local_e4;
      local_e4 = fVar4;
    }
    else {
      auVar1 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      local_e4 = auVar1._0_4_;
    }
  }
  fVar4 = 1.0;
  if ((local_dc < fVar6) && (fVar4 = 1.0, local_dc < local_e4)) {
    fVar4 = (*data->attenuation)(local_dc,fVar6,local_e4,local_e0);
  }
  local_e0 = fVar4;
  if (source->spatial == true) {
    fVar4 = local_e8 * data->look_at[2] + local_f0 * data->look_at[0] + fStack_ec * data->look_at[1]
    ;
    fVar6 = local_e8 * data->look_at[5] + local_f0 * data->look_at[3] + fStack_ec * data->look_at[4]
    ;
    local_e8 = local_e8 * data->look_at[8] +
               local_f0 * data->look_at[6] + fStack_ec * data->look_at[7];
    local_f0 = fVar4;
    fStack_ec = fVar6;
    if (local_e4 < local_dc) {
      fVar5 = 1.0 - local_e4 / local_dc;
      auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar5 + fVar5)));
      fVar7 = auVar1._0_4_;
      fVar5 = 1.0 - fVar7;
      local_f0 = fVar4 * fVar5 + fVar7 * 0.0;
      fStack_ec = fVar6 * fVar5 + fVar7 * 0.0;
      local_e8 = local_e8 * fVar5 + fVar7;
    }
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f1,&data->vbap);
    if ((ulong)local_f1 != 0) {
      uVar2 = 0;
      do {
        auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                            ZEXT416((uint)(local_e0 * local_a8[uVar2])));
        local_a8[uVar2] = auVar1._0_4_;
        uVar2 = uVar2 + 1;
      } while (local_f1 != uVar2);
    }
    if ((local_dc < local_e4) && (data->surround == false)) {
      fVar4 = local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        auVar1 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
        fVar4 = auVar1._0_4_;
      }
      fVar7 = 0.0;
      fVar6 = 0.0;
      fVar5 = 0.0;
      if (0.0 < fVar4) {
        fVar7 = local_f0 / fVar4;
        fVar5 = local_e8 / fVar4;
        fVar6 = (fStack_ec / fVar4) * 0.0;
      }
      if ((fVar5 + fVar7 * 0.0 + fVar6 < 0.0) && ((ulong)local_f1 != 0)) {
        uVar2 = 0;
        do {
          uVar3 = (ulong)(data->channels).positions[local_d8[uVar2]];
          if ((uVar3 < 0x21) && ((0x122020202U >> (uVar3 & 0x3f) & 1) != 0)) {
            local_a8[uVar2] = -local_a8[uVar2];
          }
          uVar2 = uVar2 + 1;
        } while (local_f1 != uVar2);
      }
    }
  }
  else {
    local_f0 = 0.0;
    fStack_ec = 0.0;
    local_e8 = 0.0;
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f1,&data->vbap);
    if ((ulong)local_f1 != 0) {
      uVar2 = 0;
      do {
        auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                            ZEXT416((uint)(local_e0 * local_a8[uVar2])));
        local_a8[uVar2] = auVar1._0_4_;
        uVar2 = uVar2 + 1;
      } while (local_f1 != uVar2);
    }
  }
  memcpy(source->volumes,local_a8,(ulong)local_f1 << 2);
  memcpy(source->speakers,local_d8,(ulong)local_f1 << 2);
  source->speaker_count = local_f1;
  return;
}

Assistant:

VECTORIZE static inline void calculate_volumes(float *lvolume, float *rvolume, struct plane_source *source, struct plane_mixer_data *data){
  float min_dist = source->min_distance;
  float max_dist = source->max_distance;
  float roll = source->rolloff;
  float div = data->volume;
  float *src = source->location;
  float *dst = data->location;
  float distance = clamp(min_dist, dist(src, dst), max_dist);
  float volume = div * data->attenuation(min_dist, max_dist, distance, roll);
  float xdiff = src[0]-dst[0];
  float xdist = fabs(xdiff);
  float pan = (xdist <= min_dist)
    ? 0.0
    : copysignf((min(max_dist,xdist)-min_dist)/(max_dist-min_dist), xdiff);
  *lvolume = volume * ((0.0<pan)?(1.0f-pan):1.0f);
  *rvolume = volume * ((pan<0.0)?(1.0f+pan):1.0f);
}